

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.cpp
# Opt level: O0

void set_sigchld_action(_func_void_int_siginfo_t_ptr_void_ptr *callback)

{
  int iVar1;
  ContextManager *pCVar2;
  string local_c8;
  _union_1457 local_a8;
  sigaction action;
  _func_void_int_siginfo_t_ptr_void_ptr *callback_local;
  
  action.sa_restorer = (_func_void *)callback;
  memset(&local_a8,0,0x98);
  local_a8.sa_handler = (__sighandler_t)action.sa_restorer;
  action.sa_mask.__val[0xf]._0_4_ = 0x10000004;
  iVar1 = sigaction(0x11,(sigaction *)&local_a8,(sigaction *)0x0);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_c8,"Failed to set SIGCHLD sigaction: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return;
}

Assistant:

void set_sigchld_action(void (*callback)(int, siginfo_t *, void *)) {
    struct sigaction action{};
    action.sa_sigaction = callback;
    action.sa_flags = (SA_SIGINFO | SA_RESTART);
    if (sigaction(SIGCHLD, &action, nullptr) != 0) {
        die(format("Failed to set SIGCHLD sigaction: %m"));
    }
}